

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixxx.cc
# Opt level: O1

void __thiscall ixxx::ansi::noenv::test_method(noenv *this)

{
  char *__s;
  bool caught;
  undefined1 local_101;
  undefined **local_100;
  undefined1 local_f8;
  undefined8 *local_f0;
  undefined1 **local_e8;
  string s;
  undefined1 *local_c0;
  bool *local_b8;
  undefined1 local_b0;
  undefined8 local_a8;
  shared_count sStack_a0;
  undefined **local_98;
  undefined1 local_90;
  undefined8 *local_88;
  char *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  char *local_68;
  char *local_60;
  char *local_28;
  char *local_20;
  
  caught = false;
  __s = getenv("DOESNOTEXISTNOTEXIST");
  std::__cxx11::string::string<std::allocator<char>>((string *)&s,__s,(allocator<char> *)&local_100)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)s._M_dataplus._M_p != &s.field_2) {
    operator_delete(s._M_dataplus._M_p,s.field_2._M_allocated_capacity + 1);
  }
  local_68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/gsauthof[P]libixxx/unittest/ixxx.cc";
  local_60 = "";
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_68,0x7c);
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_001247e8;
  local_88 = &boost::unit_test::lazy_ostream::inst;
  local_80 = "";
  local_c0 = &local_101;
  local_101 = 1;
  local_b8 = &caught;
  local_b0 = caught;
  local_a8 = 0;
  sStack_a0.pi_ = (sp_counted_base *)0x0;
  local_28 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/gsauthof[P]libixxx/unittest/ixxx.cc";
  local_20 = "";
  s.field_2._8_8_ = &local_b8;
  s._M_string_length._0_1_ = 0;
  s._M_dataplus._M_p = "|?\x11";
  s.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_e8 = &local_c0;
  local_f8 = 0;
  local_100 = &PTR__lazy_ostream_00124860;
  local_f0 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_a0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( noenv )
    {
      bool caught = false;
      try {
        string s(ansi::getenv("DOESNOTEXISTNOTEXIST"));
      } catch (getenv_error &e) {
        caught = true;
        BOOST_CHECK(e.function() == Function::GETENV);
      }
      BOOST_CHECK_EQUAL(caught, true);
    }